

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int do_floor(vorb *f,Mapping *map,int i,int n,float *target,YTYPE *finalY,uint8 *step2_flag)

{
  int x0;
  uint y0;
  uint x1;
  uint uVar1;
  Floor *pFVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vorb *in_RDI;
  long in_R8;
  float *in_R9;
  bool bVar3;
  int hx;
  int hy;
  int ly;
  int lx;
  int q;
  int j;
  Floor1 *g;
  int FAudio_floor;
  int s;
  int n2;
  int local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  int in_stack_ffffffffffffffc0;
  int local_4;
  
  x0 = in_ECX >> 1;
  y0 = (uint)*(byte *)(*(long *)(in_RSI + 8) + (long)in_EDX * 3 + 2);
  x1 = (uint)*(byte *)(in_RSI + 0x11 + (long)(int)y0);
  if (in_RDI->floor_types[(int)x1] == 0) {
    local_4 = error(in_RDI,VORBIS_invalid_stream);
  }
  else {
    pFVar2 = in_RDI->floor_config + (int)x1;
    local_54 = 0;
    local_58 = (int)*(short *)in_R9 * (uint)(pFVar2->floor1).floor1_multiplier;
    for (local_50 = 1; local_50 < (pFVar2->floor1).values; local_50 = local_50 + 1) {
      uVar1 = (uint)*(byte *)((long)pFVar2 + (long)local_50 + 0x346);
      if (-1 < *(short *)((long)in_R9 + (long)(int)uVar1 * 2)) {
        local_58 = (int)*(short *)((long)in_R9 + (long)(int)uVar1 * 2) *
                   (uint)(pFVar2->floor1).floor1_multiplier;
        uVar1 = (uint)*(ushort *)((long)pFVar2 + (long)(int)uVar1 * 2 + 0x152);
        bVar3 = local_54 != uVar1;
        local_54 = uVar1;
        if (bVar3) {
          draw_line(in_R9,x0,y0,x1,in_stack_ffffffffffffffc0,(int)((ulong)pFVar2 >> 0x20));
        }
      }
    }
    if ((int)local_54 < x0) {
      for (local_4c = local_54; (int)local_4c < x0; local_4c = local_4c + 1) {
        *(float *)(in_R8 + (long)(int)local_4c * 4) =
             inverse_db_table[local_58] * *(float *)(in_R8 + (long)(int)local_4c * 4);
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int do_floor(vorb *f, Mapping *map, int i, int n, float *target, YTYPE *finalY, uint8 *step2_flag)
{
   int n2 = n >> 1;
   int s = map->chan[i].mux, floor;
   floor = map->submap_floor[s];
   if (f->floor_types[floor] == 0) {
      return error(f, VORBIS_invalid_stream);
   } else {
      Floor1 *g = &f->floor_config[floor].floor1;
      int j,q;
      int lx = 0, ly = finalY[0] * g->floor1_multiplier;
      for (q=1; q < g->values; ++q) {
         j = g->sorted_order[q];
         #ifndef STB_VORBIS_NO_DEFER_FLOOR
         if (finalY[j] >= 0)
         #else
         if (step2_flag[j])
         #endif
         {
            int hy = finalY[j] * g->floor1_multiplier;
            int hx = g->Xlist[j];
            if (lx != hx)
               draw_line(target, lx,ly, hx,hy, n2);
            CHECK(f);
            lx = hx, ly = hy;
         }
      }
      if (lx < n2) {
         // optimization of: draw_line(target, lx,ly, n,ly, n2);
         for (j=lx; j < n2; ++j)
            LINE_OP(target[j], inverse_db_table[ly]);
         CHECK(f);
      }
   }
   return TRUE;
}